

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall despot::util::tinyxml::TiXmlElement::CopyTo(TiXmlElement *this,TiXmlElement *target)

{
  int iVar1;
  size_t len;
  undefined4 extraout_var;
  TiXmlNode *pTVar2;
  char *__s;
  TiXmlAttribute *pTVar3;
  
  __s = ((this->super_TiXmlNode).value.rep_)->str;
  len = strlen(__s);
  TiXmlString::assign(&(target->super_TiXmlNode).value,__s,len);
  (target->super_TiXmlNode).super_TiXmlBase.userData =
       (this->super_TiXmlNode).super_TiXmlBase.userData;
  pTVar3 = (this->attributeSet).sentinel.next;
  if (pTVar3 != (TiXmlAttribute *)0x0 && pTVar3 != &(this->attributeSet).sentinel) {
    do {
      SetAttribute(target,((pTVar3->name).rep_)->str,((pTVar3->value).rep_)->str);
      pTVar3 = pTVar3->next;
      if ((((pTVar3->value).rep_)->size == 0) && (((pTVar3->name).rep_)->size == 0)) {
        pTVar3 = (TiXmlAttribute *)0x0;
      }
    } while (pTVar3 != (TiXmlAttribute *)0x0);
  }
  for (pTVar2 = (this->super_TiXmlNode).firstChild; pTVar2 != (TiXmlNode *)0x0;
      pTVar2 = pTVar2->next) {
    iVar1 = (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[0x10])(pTVar2);
    TiXmlNode::LinkEndChild(&target->super_TiXmlNode,(TiXmlNode *)CONCAT44(extraout_var,iVar1));
  }
  return;
}

Assistant:

void TiXmlElement::CopyTo(TiXmlElement* target) const {
	// superclass:
	TiXmlNode::CopyTo(target);

	// Element class:
	// Clone the attributes, then clone the children.
	const TiXmlAttribute* attribute = 0;
	for (attribute = attributeSet.First(); attribute;
		attribute = attribute->Next()) {
		target->SetAttribute(attribute->Name(), attribute->Value());
	}

	TiXmlNode* node = 0;
	for (node = firstChild; node; node = node->NextSibling()) {
		target->LinkEndChild(node->Clone());
	}
}